

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O3

void __thiscall
swrenderer::DrawWallMasked1PalCommand::Execute(DrawWallMasked1PalCommand *this,DrawerThread *thread)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint uVar5;
  ulong uVar6;
  int pass_skip;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  uint8_t *puVar11;
  
  iVar1 = (this->super_PalWall1Command)._count;
  iVar8 = (this->super_PalWall1Command).super_DrawerCommand._dest_y;
  iVar10 = thread->pass_end_y - iVar8;
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  if (iVar1 < iVar10) {
    iVar10 = iVar1;
  }
  uVar7 = thread->pass_start_y - iVar8;
  if ((int)uVar7 < 1) {
    uVar7 = 0;
  }
  iVar1 = thread->num_cores;
  iVar8 = (iVar1 - (int)((iVar8 + uVar7) - thread->core) % iVar1) % iVar1;
  uVar9 = (long)(int)((~uVar7 + iVar1 + iVar10) - iVar8) / (long)iVar1;
  uVar6 = uVar9 & 0xffffffff;
  if (0 < (int)uVar9) {
    puVar3 = (this->super_PalWall1Command)._colormap;
    puVar4 = (this->super_PalWall1Command)._source;
    iVar10 = (this->super_PalWall1Command)._pitch;
    iVar8 = iVar8 + uVar7;
    puVar11 = (this->super_PalWall1Command)._dest + iVar10 * iVar8;
    iVar2 = *(int *)&(this->super_PalWall1Command).super_DrawerCommand.field_0xc;
    uVar7 = iVar8 * iVar2 + (this->super_PalWall1Command)._texturefrac;
    iVar8 = (this->super_PalWall1Command)._fracbits;
    do {
      uVar9 = (ulong)puVar4[uVar7 >> ((byte)iVar8 & 0x3f)];
      if (uVar9 != 0) {
        *puVar11 = puVar3[uVar9];
      }
      uVar7 = uVar7 + iVar2 * iVar1;
      puVar11 = puVar11 + iVar10 * iVar1;
      uVar5 = (int)uVar6 - 1;
      uVar6 = (ulong)uVar5;
    } while (uVar5 != 0);
  }
  return;
}

Assistant:

void DrawWallMasked1PalCommand::Execute(DrawerThread *thread)
	{
		uint32_t fracstep = _iscale;
		uint32_t frac = _texturefrac;
		uint8_t *colormap = _colormap;
		int count = _count;
		const uint8_t *source = _source;
		uint8_t *dest = _dest;
		int bits = _fracbits;
		int pitch = _pitch;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		frac += fracstep * thread->skipped_by_thread(_dest_y);
		fracstep *= thread->num_cores;
		pitch *= thread->num_cores;

		do
		{
			uint8_t pix = source[frac >> bits];
			if (pix != 0)
			{
				*dest = colormap[pix];
			}
			frac += fracstep;
			dest += pitch;
		} while (--count);
	}